

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Input.cpp
# Opt level: O1

string * nite::keyboardGetText_abi_cxx11_(void)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  char *pcVar22;
  char *pcVar23;
  string *in_RDI;
  bool bVar24;
  undefined1 local_40 [8];
  string Char;
  
  local_40 = (undefined1  [8])&Char._M_string_length;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_40);
  bVar21 = keyboardCheck(0x2a);
  if (bVar21) {
LAB_00177f9b:
    bVar21 = true;
  }
  else {
    bVar21 = keyboardCheck(0x26);
    if (bVar21) goto LAB_00177f9b;
    bVar21 = false;
  }
  bVar20 = KeysCheck[0x46];
  bVar19 = KeysCheck[0x44];
  bVar18 = KeysCheck[0x39];
  bVar17 = KeysCheck[0x37];
  bVar16 = KeysCheck[0x35];
  bVar15 = KeysCheck[0x33];
  bVar14 = KeysCheck[0x32];
  bVar13 = KeysCheck[0x31];
  bVar12 = KeysCheck[0x30];
  bVar11 = KeysCheck[0x2f];
  bVar10 = KeysCheck[0x2e];
  bVar9 = KeysCheck[0x23];
  bVar8 = KeysCheck[0x22];
  bVar7 = KeysCheck[0x21];
  bVar6 = KeysCheck[0x20];
  bVar5 = KeysCheck[0x1f];
  bVar4 = KeysCheck[0x1e];
  bVar3 = KeysCheck[0x1d];
  bVar2 = KeysCheck[0x1c];
  bVar1 = KeysCheck[0x1b];
  bVar24 = KeysCheck[0x1a];
  KeysState[0x44] = false;
  KeysStatePressed[0x44] = false;
  isKeysStatePressed[0x44] = false;
  KeysCheck[0x44] = false;
  if (bVar19 == true) {
    pcVar22 = "_";
    pcVar23 = "-";
  }
  else {
    KeysState[0x37] = false;
    KeysStatePressed[0x37] = false;
    isKeysStatePressed[0x37] = false;
    KeysCheck[0x37] = false;
    if (bVar17 == true) {
      pcVar22 = "+";
      pcVar23 = "=";
    }
    else {
      KeysState[0x31] = false;
      KeysStatePressed[0x31] = false;
      isKeysStatePressed[0x31] = false;
      KeysCheck[0x31] = false;
      if (bVar13 == true) {
        pcVar22 = "<";
        pcVar23 = ",";
      }
      else {
        KeysState[0x32] = false;
        KeysStatePressed[0x32] = false;
        isKeysStatePressed[0x32] = false;
        KeysCheck[0x32] = false;
        if (bVar14 == true) {
          pcVar22 = ">";
          pcVar23 = ".";
        }
        else {
          KeysState[0x46] = false;
          KeysStatePressed[0x46] = false;
          isKeysStatePressed[0x46] = false;
          KeysCheck[0x46] = false;
          if (bVar20 != true) {
            KeysState[0x33] = false;
            KeysStatePressed[0x33] = false;
            isKeysStatePressed[0x33] = false;
            KeysCheck[0x33] = false;
            if (bVar15 == true) {
              pcVar22 = "\"";
              pcVar23 = "\'";
LAB_0017843e:
              if (bVar21) {
                pcVar23 = pcVar22;
              }
            }
            else {
              KeysState[0x30] = false;
              KeysStatePressed[0x30] = false;
              isKeysStatePressed[0x30] = false;
              KeysCheck[0x30] = false;
              if (bVar12 == true) {
                pcVar22 = ":";
                pcVar23 = ";";
                goto LAB_0017843e;
              }
              KeysState[0x2e] = false;
              KeysStatePressed[0x2e] = false;
              isKeysStatePressed[0x2e] = false;
              KeysCheck[0x2e] = false;
              if (bVar10 == true) {
                pcVar22 = "{";
                pcVar23 = "[";
                goto LAB_0017843e;
              }
              KeysState[0x2f] = false;
              KeysStatePressed[0x2f] = false;
              isKeysStatePressed[0x2f] = false;
              KeysCheck[0x2f] = false;
              if (bVar11 == true) {
                pcVar22 = "}";
                pcVar23 = "]";
                goto LAB_0017843e;
              }
              KeysState[0x35] = false;
              KeysStatePressed[0x35] = false;
              isKeysStatePressed[0x35] = false;
              KeysCheck[0x35] = false;
              if (bVar16 == true) {
                pcVar22 = "|";
                pcVar23 = "\\";
                goto LAB_0017843e;
              }
              KeysState[0x1a] = false;
              KeysStatePressed[0x1a] = false;
              isKeysStatePressed[0x1a] = false;
              KeysCheck[0x1a] = false;
              if (bVar24 == true) {
                pcVar22 = ")";
                pcVar23 = "0";
                goto LAB_0017843e;
              }
              KeysState[0x1b] = false;
              KeysStatePressed[0x1b] = false;
              isKeysStatePressed[0x1b] = false;
              KeysCheck[0x1b] = false;
              if (bVar1 == true) {
                pcVar22 = "!";
                pcVar23 = "1";
                goto LAB_0017843e;
              }
              KeysState[0x1c] = false;
              KeysStatePressed[0x1c] = false;
              isKeysStatePressed[0x1c] = false;
              KeysCheck[0x1c] = false;
              if (bVar2 == true) {
                pcVar22 = "@";
                pcVar23 = "2";
                goto LAB_0017843e;
              }
              KeysState[0x1d] = false;
              KeysStatePressed[0x1d] = false;
              isKeysStatePressed[0x1d] = false;
              KeysCheck[0x1d] = false;
              if (bVar3 == true) {
                pcVar22 = "#";
                pcVar23 = "3";
                goto LAB_0017843e;
              }
              KeysState[0x1e] = false;
              KeysStatePressed[0x1e] = false;
              isKeysStatePressed[0x1e] = false;
              KeysCheck[0x1e] = false;
              if (bVar4 == true) {
                pcVar22 = "$";
                pcVar23 = "4";
                goto LAB_0017843e;
              }
              KeysState[0x1f] = false;
              KeysStatePressed[0x1f] = false;
              isKeysStatePressed[0x1f] = false;
              KeysCheck[0x1f] = false;
              if (bVar5 == true) {
                pcVar22 = "%";
                pcVar23 = "5";
                goto LAB_0017843e;
              }
              KeysState[0x20] = false;
              KeysStatePressed[0x20] = false;
              isKeysStatePressed[0x20] = false;
              KeysCheck[0x20] = false;
              if (bVar6 == true) {
                pcVar22 = "^";
                pcVar23 = "6";
                goto LAB_0017843e;
              }
              KeysState[0x21] = false;
              KeysStatePressed[0x21] = false;
              isKeysStatePressed[0x21] = false;
              KeysCheck[0x21] = false;
              if (bVar7 == true) {
                pcVar22 = "&";
                pcVar23 = "7";
                goto LAB_0017843e;
              }
              KeysState[0x22] = false;
              KeysStatePressed[0x22] = false;
              isKeysStatePressed[0x22] = false;
              KeysCheck[0x22] = false;
              if (bVar8 == true) {
                pcVar22 = "*";
                pcVar23 = "8";
                goto LAB_0017843e;
              }
              KeysState[0x23] = false;
              KeysStatePressed[0x23] = false;
              isKeysStatePressed[0x23] = false;
              KeysCheck[0x23] = false;
              if (bVar9 == true) {
                pcVar22 = "(";
                pcVar23 = "9";
                goto LAB_0017843e;
              }
              KeysState[0] = false;
              KeysStatePressed[0] = false;
              isKeysStatePressed[0] = false;
              bVar24 = KeysCheck[0] == false;
              KeysCheck[0] = false;
              if (bVar24) {
                KeysState[1] = false;
                KeysStatePressed[1] = false;
                isKeysStatePressed[1] = false;
                bVar24 = KeysCheck[1] == false;
                KeysCheck[1] = false;
                if (bVar24) {
                  KeysState[2] = false;
                  KeysStatePressed[2] = false;
                  isKeysStatePressed[2] = false;
                  bVar24 = KeysCheck[2] == false;
                  KeysCheck[2] = false;
                  if (bVar24) {
                    KeysState[3] = false;
                    KeysStatePressed[3] = false;
                    isKeysStatePressed[3] = false;
                    bVar24 = KeysCheck[3] == false;
                    KeysCheck[3] = false;
                    if (bVar24) {
                      KeysState[4] = false;
                      KeysStatePressed[4] = false;
                      isKeysStatePressed[4] = false;
                      bVar24 = KeysCheck[4] == false;
                      KeysCheck[4] = false;
                      if (bVar24) {
                        KeysState[5] = false;
                        KeysStatePressed[5] = false;
                        isKeysStatePressed[5] = false;
                        bVar24 = KeysCheck[5] == false;
                        KeysCheck[5] = false;
                        if (bVar24) {
                          KeysState[6] = false;
                          KeysStatePressed[6] = false;
                          isKeysStatePressed[6] = false;
                          bVar24 = KeysCheck[6] == false;
                          KeysCheck[6] = false;
                          if (bVar24) {
                            KeysState[7] = false;
                            KeysStatePressed[7] = false;
                            isKeysStatePressed[7] = false;
                            bVar24 = KeysCheck[7] == false;
                            KeysCheck[7] = false;
                            if (bVar24) {
                              KeysState[8] = false;
                              KeysStatePressed[8] = false;
                              isKeysStatePressed[8] = false;
                              bVar24 = KeysCheck[8] == false;
                              KeysCheck[8] = false;
                              if (bVar24) {
                                KeysState[9] = false;
                                KeysStatePressed[9] = false;
                                isKeysStatePressed[9] = false;
                                bVar24 = KeysCheck[9] == false;
                                KeysCheck[9] = false;
                                if (bVar24) {
                                  KeysState[10] = false;
                                  KeysStatePressed[10] = false;
                                  isKeysStatePressed[10] = false;
                                  bVar24 = KeysCheck[10] == false;
                                  KeysCheck[10] = false;
                                  if (bVar24) {
                                    KeysState[0xb] = false;
                                    KeysStatePressed[0xb] = false;
                                    isKeysStatePressed[0xb] = false;
                                    bVar24 = KeysCheck[0xb] == false;
                                    KeysCheck[0xb] = false;
                                    if (bVar24) {
                                      KeysState[0xc] = false;
                                      KeysStatePressed[0xc] = false;
                                      isKeysStatePressed[0xc] = false;
                                      bVar24 = KeysCheck[0xc] == false;
                                      KeysCheck[0xc] = false;
                                      if (bVar24) {
                                        KeysState[0xd] = false;
                                        KeysStatePressed[0xd] = false;
                                        isKeysStatePressed[0xd] = false;
                                        bVar24 = KeysCheck[0xd] == false;
                                        KeysCheck[0xd] = false;
                                        if (bVar24) {
                                          KeysState[0xe] = false;
                                          KeysStatePressed[0xe] = false;
                                          isKeysStatePressed[0xe] = false;
                                          bVar24 = KeysCheck[0xe] == false;
                                          KeysCheck[0xe] = false;
                                          if (bVar24) {
                                            KeysState[0xf] = false;
                                            KeysStatePressed[0xf] = false;
                                            isKeysStatePressed[0xf] = false;
                                            bVar24 = KeysCheck[0xf] == false;
                                            KeysCheck[0xf] = false;
                                            if (bVar24) {
                                              KeysState[0x10] = false;
                                              KeysStatePressed[0x10] = false;
                                              isKeysStatePressed[0x10] = false;
                                              bVar24 = KeysCheck[0x10] == false;
                                              KeysCheck[0x10] = false;
                                              if (bVar24) {
                                                KeysState[0x11] = false;
                                                KeysStatePressed[0x11] = false;
                                                isKeysStatePressed[0x11] = false;
                                                bVar24 = KeysCheck[0x11] == false;
                                                KeysCheck[0x11] = false;
                                                if (bVar24) {
                                                  KeysState[0x12] = false;
                                                  KeysStatePressed[0x12] = false;
                                                  isKeysStatePressed[0x12] = false;
                                                  bVar24 = KeysCheck[0x12] == false;
                                                  KeysCheck[0x12] = false;
                                                  if (bVar24) {
                                                    KeysState[0x13] = false;
                                                    KeysStatePressed[0x13] = false;
                                                    isKeysStatePressed[0x13] = false;
                                                    bVar24 = KeysCheck[0x13] == false;
                                                    KeysCheck[0x13] = false;
                                                    if (bVar24) {
                                                      KeysState[0x14] = false;
                                                      KeysStatePressed[0x14] = false;
                                                      isKeysStatePressed[0x14] = false;
                                                      bVar24 = KeysCheck[0x14] == false;
                                                      KeysCheck[0x14] = false;
                                                      if (bVar24) {
                                                        KeysState[0x15] = false;
                                                        KeysStatePressed[0x15] = false;
                                                        isKeysStatePressed[0x15] = false;
                                                        bVar24 = KeysCheck[0x15] == false;
                                                        KeysCheck[0x15] = false;
                                                        if (bVar24) {
                                                          KeysState[0x16] = false;
                                                          KeysStatePressed[0x16] = false;
                                                          isKeysStatePressed[0x16] = false;
                                                          bVar24 = KeysCheck[0x16] == false;
                                                          KeysCheck[0x16] = false;
                                                          if (bVar24) {
                                                            KeysState[0x17] = false;
                                                            KeysStatePressed[0x17] = false;
                                                            isKeysStatePressed[0x17] = false;
                                                            bVar24 = KeysCheck[0x17] == false;
                                                            KeysCheck[0x17] = false;
                                                            if (bVar24) {
                                                              KeysState[0x18] = false;
                                                              KeysStatePressed[0x18] = false;
                                                              isKeysStatePressed[0x18] = false;
                                                              bVar24 = KeysCheck[0x18] == false;
                                                              KeysCheck[0x18] = false;
                                                              if (bVar24) {
                                                                KeysState[0x19] = false;
                                                                KeysStatePressed[0x19] = false;
                                                                isKeysStatePressed[0x19] = false;
                                                                bVar24 = KeysCheck[0x19] == false;
                                                                KeysCheck[0x19] = false;
                                                                if (bVar24) {
                                                                  KeysState[0x39] = false;
                                                                  KeysStatePressed[0x39] = false;
                                                                  isKeysStatePressed[0x39] = false;
                                                                  KeysCheck[0x39] = false;
                                                                  if (bVar18 != true)
                                                                  goto LAB_001780c7;
                                                                  pcVar23 = " ";
                                                                }
                                                                else {
                                                                  pcVar23 = "z";
                                                                }
                                                              }
                                                              else {
                                                                pcVar23 = "y";
                                                              }
                                                            }
                                                            else {
                                                              pcVar23 = "x";
                                                            }
                                                          }
                                                          else {
                                                            pcVar23 = "w";
                                                          }
                                                        }
                                                        else {
                                                          pcVar23 = "v";
                                                        }
                                                      }
                                                      else {
                                                        pcVar23 = "u";
                                                      }
                                                    }
                                                    else {
                                                      pcVar23 = "t";
                                                    }
                                                  }
                                                  else {
                                                    pcVar23 = "s";
                                                  }
                                                }
                                                else {
                                                  pcVar23 = "r";
                                                }
                                              }
                                              else {
                                                pcVar23 = "q";
                                              }
                                            }
                                            else {
                                              pcVar23 = "p";
                                            }
                                          }
                                          else {
                                            pcVar23 = "o";
                                          }
                                        }
                                        else {
                                          pcVar23 = "n";
                                        }
                                      }
                                      else {
                                        pcVar23 = "m";
                                      }
                                    }
                                    else {
                                      pcVar23 = "l";
                                    }
                                  }
                                  else {
                                    pcVar23 = "k";
                                  }
                                }
                                else {
                                  pcVar23 = "j";
                                }
                              }
                              else {
                                pcVar23 = "i";
                              }
                            }
                            else {
                              pcVar23 = "h";
                            }
                          }
                          else {
                            pcVar23 = "g";
                          }
                        }
                        else {
                          pcVar23 = "f";
                        }
                      }
                      else {
                        pcVar23 = "e";
                      }
                    }
                    else {
                      pcVar23 = "d";
                    }
                  }
                  else {
                    pcVar23 = "c";
                  }
                }
                else {
                  pcVar23 = "b";
                }
              }
              else {
                pcVar23 = "a";
              }
            }
            std::__cxx11::string::operator=((string *)local_40,pcVar23);
            goto LAB_001780c7;
          }
          pcVar22 = "?";
          pcVar23 = "/";
        }
      }
    }
  }
  if (bVar21) {
    pcVar23 = pcVar22;
  }
  std::__cxx11::string::_M_replace((ulong)local_40,0,Char._M_dataplus._M_p,(ulong)pcVar23);
LAB_001780c7:
  if (bVar21) {
    toUpper(in_RDI,(string *)local_40);
  }
  else {
    (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
    std::__cxx11::string::_M_construct<char*>();
  }
  if (local_40 != (undefined1  [8])&Char._M_string_length) {
    operator_delete((void *)local_40);
  }
  return in_RDI;
}

Assistant:

String nite::keyboardGetText(){
	String Char = "";
	bool Upper = 0;
	if (nite::keyboardCheck(keyRSHIFT) or nite::keyboardCheck(keyLSHIFT)){
		Upper = 1;
	}
	if (nite::keyboardPressOnce(keySUBTRACT)){
		Char = ( Upper ? "_":"-" );
	}else
	if (nite::keyboardPressOnce(keyEQUAL)){
		Char = ( Upper ? "+":"=" );
	}else
	if (nite::keyboardPressOnce(keyCOMMA)){
		Char = ( Upper ? "<":"," );
	}else
	if (nite::keyboardPressOnce(keyPERIOD)){
		Char = ( Upper ? ">":"." );
	}else
	if (nite::keyboardPressOnce(keyDIVIDE)){
		Char = ( Upper ? "?":"/" );
	}else
	if (nite::keyboardPressOnce(keyQUOTE)){
		Char = ( Upper ? "\"":"'" );
	}else
	if (nite::keyboardPressOnce(keySEMICOLON)){
		Char = ( Upper ? ":":";" );
	}else
	if (nite::keyboardPressOnce(keyLBRACKET)){
		Char = ( Upper ? "{":"[" );
	}else
	if (nite::keyboardPressOnce(keyRBRACKET)){
		Char = ( Upper ? "}":"]" );
	}else
	if (nite::keyboardPressOnce(keyBACKSLASH)){
		Char = ( Upper ? "|":"\\" );
	}else
	if (nite::keyboardPressOnce(key0)){
		Char = ( Upper ? ")":"0" );
	}else
	if (nite::keyboardPressOnce(key1)){
		Char = ( Upper ? "!":"1" );
	}else
	if (nite::keyboardPressOnce(key2)){
		Char = ( Upper ? "@":"2" );
	}else
	if (nite::keyboardPressOnce(key3)){
		Char = ( Upper ? "#":"3" );
	}else
	if (nite::keyboardPressOnce(key4)){
		Char = ( Upper ? "$":"4" );
	}else
	if (nite::keyboardPressOnce(key5)){
		Char = ( Upper ? "%":"5" );
	}else
	if (nite::keyboardPressOnce(key6)){
		Char = ( Upper ? "^":"6" );
	}else
	if (nite::keyboardPressOnce(key7)){
		Char = ( Upper ? "&":"7" );
	}else
	if (nite::keyboardPressOnce(key8)){
		Char = ( Upper ? "*":"8" );
	}else
	if (nite::keyboardPressOnce(key9)){
		Char = ( Upper ? "(":"9" );
	}else
	if (nite::keyboardPressOnce(keyA)){
		Char = "a";
	}else
	if (nite::keyboardPressOnce(keyB)){
		Char = "b";
	}else
	if (nite::keyboardPressOnce(keyC)){
		Char = "c";
	}else
	if (nite::keyboardPressOnce(keyD)){
		Char = "d";
	}else
	if (nite::keyboardPressOnce(keyE)){
		Char = "e";
	}else
	if (nite::keyboardPressOnce(keyF)){
		Char = "f";
	}else
	if (nite::keyboardPressOnce(keyG)){
		Char = "g";
	}else
	if (nite::keyboardPressOnce(keyH)){
		Char = "h";
	}else
	if (nite::keyboardPressOnce(keyI)){
		Char = "i";
	}else
	if (nite::keyboardPressOnce(keyJ)){
		Char = "j";
	}else
	if (nite::keyboardPressOnce(keyK)){
		Char = "k";
	}else
	if (nite::keyboardPressOnce(keyL)){
		Char = "l";
	}else
	if (nite::keyboardPressOnce(keyM)){
		Char = "m";
	}else
	if (nite::keyboardPressOnce(keyN)){
		Char = "n";
	}else
	if (nite::keyboardPressOnce(keyO)){
		Char = "o";
	}else
	if (nite::keyboardPressOnce(keyP)){
		Char = "p";
	}else
	if (nite::keyboardPressOnce(keyQ)){
		Char = "q";
	}else
	if (nite::keyboardPressOnce(keyR)){
		Char = "r";
	}else
	if (nite::keyboardPressOnce(keyS)){
		Char = "s";
	}else
	if (nite::keyboardPressOnce(keyT)){
		Char = "t";
	}else
	if (nite::keyboardPressOnce(keyU)){
		Char = "u";
	}else
	if (nite::keyboardPressOnce(keyV)){
		Char = "v";
	}else
	if (nite::keyboardPressOnce(keyW)){
		Char = "w";
	}else
	if (nite::keyboardPressOnce(keyX)){
		Char = "x";
	}else
	if (nite::keyboardPressOnce(keyY)){
		Char = "y";
	}else
	if (nite::keyboardPressOnce(keyZ)){
		Char = "z";
	}else
	if (nite::keyboardPressOnce(keySPACE)){
		Char = " ";
	}
	return (Upper ? nite::toUpper(Char) : Char);
}